

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t __thiscall
duckdb::HexUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
          (HexUhugeIntOperator *this,uhugeint_t input,Vector *result)

{
  long lVar1;
  HexUhugeIntOperator *pHVar2;
  StringVector *this_00;
  undefined1 *puVar3;
  char *pcVar4;
  HexUhugeIntOperator *pHVar5;
  ulong uVar6;
  uint64_t upper;
  Vector *vector;
  ulong uVar7;
  anon_union_16_2_67f50693_for_value aVar8;
  string_t target;
  undefined1 local_28 [16];
  undefined1 auVar9 [12];
  char *pcVar10;
  
  this_00 = (StringVector *)input.upper;
  pHVar5 = (HexUhugeIntOperator *)input.lower;
  lVar1 = 0x3f;
  pHVar2 = pHVar5;
  if (((pHVar5 == (HexUhugeIntOperator *)0x0) &&
      (lVar1 = 0x7f, pHVar2 = this, this == (HexUhugeIntOperator *)0x0)) ||
     (uVar6 = (ulong)pHVar2 >> 1 | (ulong)pHVar2, uVar6 = uVar6 >> 2 | uVar6,
     uVar6 = uVar6 >> 4 | uVar6, uVar6 = uVar6 >> 8 | uVar6, uVar6 = uVar6 >> 0x10 | uVar6,
     uVar6 = (ulong)(lVar1 - *(long *)(&DAT_01ee55e0 +
                                      ((uVar6 >> 0x20 | uVar6) * 0x3f79d71b4cb0a89 >> 0x3a) * 8)) >>
             2, uVar6 == 0x20)) {
    local_28 = (undefined1  [16])
               StringVector::EmptyString(this_00,(Vector *)&DAT_00000001,(idx_t)this_00);
    puVar3 = local_28._8_8_;
    if (local_28._0_4_ < 0xd) {
      puVar3 = local_28 + 4;
    }
    *puVar3 = 0x30;
    uVar6 = (ulong)local_28._0_4_;
    if (uVar6 < 0xd) goto LAB_01c58d09;
    goto LAB_01c58d1d;
  }
  vector = (Vector *)(0x20 - uVar6);
  local_28 = (undefined1  [16])StringVector::EmptyString(this_00,vector,(idx_t)this_00);
  uVar6 = local_28._0_8_;
  pcVar4 = local_28._8_8_;
  if (local_28._0_4_ < 0xd) {
    pcVar4 = local_28 + 4;
  }
  uVar7 = (long)vector * 4;
  if (uVar7 < 0x44) {
    if (uVar7 != 0) goto LAB_01c58cd6;
  }
  else {
    do {
      *pcVar4 = "0123456789ABCDEF"[(uint)((ulong)pHVar5 >> ((char)uVar7 + 0xbcU & 0x3f)) & 0xf];
      pcVar4 = pcVar4 + 1;
      uVar7 = uVar7 - 4;
    } while (0x43 < uVar7);
LAB_01c58cd6:
    lVar1 = uVar7 - 4;
    do {
      *pcVar4 = "0123456789ABCDEF"[(uint)((ulong)this >> ((byte)lVar1 & 0x3f)) & 0xf];
      pcVar4 = pcVar4 + 1;
      lVar1 = lVar1 + -4;
    } while (lVar1 != -4);
    uVar6 = (ulong)local_28._0_4_;
  }
  if ((uint)uVar6 < 0xd) {
    uVar6 = uVar6 & 0xffffffff;
LAB_01c58d09:
    switchD_012e5a64::default(local_28 + uVar6 + 4,0,0xc - uVar6);
    aVar8._0_4_ = local_28._0_4_;
    auVar9[4] = local_28[4];
    auVar9[5] = local_28[5];
    auVar9[6] = local_28[6];
    auVar9[7] = local_28[7];
    register0x00000010 = (char *)local_28._8_8_;
    return (string_t)aVar8;
  }
LAB_01c58d1d:
  local_28._4_4_ = *(undefined4 *)local_28._8_8_;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_28;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		idx_t num_leading_zero = CountZeros<uhugeint_t>::Leading(UnsafeNumericCast<uhugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 2 - (num_leading_zero / 4);

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntHexBytes<uhugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}